

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_scope.h
# Opt level: O2

void __thiscall t_scope::resolve_const_value(t_scope *this,t_const_value *const_val,t_type *ttype)

{
  double dVar1;
  t_const_value *ptVar2;
  int iVar3;
  t_const_value_type tVar4;
  _Base_ptr p_Var5;
  t_field *ptVar6;
  t_const *ptVar7;
  t_type *ptVar8;
  int64_t iVar9;
  t_enum_value *ptVar10;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar12;
  pointer pptVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream valstm;
  
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
        if ((char)iVar3 == '\0') {
          tVar4 = t_const_value::get_type(const_val);
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
          if (tVar4 == CV_IDENTIFIER) {
            if ((char)iVar3 == '\0') {
              std::__cxx11::string::string
                        ((string *)&local_1e8,(string *)&const_val->identifierVal_);
              ptVar7 = get_constant(this,&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
              if (ptVar7 == (t_const *)0x0) {
                pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __cxa_allocate_exception(0x20);
                std::__cxx11::string::string
                          ((string *)&bStack_288,(string *)&const_val->identifierVal_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &valstm,"No enum value or constant found named \"",&bStack_288);
                std::operator+(pbVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&valstm,"\"!");
                __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              ptVar8 = t_type::get_true_type(ptVar7->type_);
              iVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[5])(ptVar8);
              if ((char)iVar3 != '\0') {
                switch(*(undefined4 *)&ptVar8[1].super_t_doc._vptr_t_doc) {
                case 0:
                  puVar12 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar12 = "Constants cannot be of type VOID";
                  __cxa_throw(puVar12,&char_const*::typeinfo,0);
                case 1:
                  std::__cxx11::string::string
                            ((string *)&local_208,(string *)&ptVar7->value_->stringVal_);
                  t_const_value::set_string(const_val,&local_208);
                  std::__cxx11::string::~string((string *)&local_208);
                  return;
                case 2:
                case 3:
                case 4:
                case 5:
                case 6:
                  iVar9 = t_const_value::get_integer(ptVar7->value_);
                  const_val->valType_ = CV_INTEGER;
                  const_val->intVal_ = iVar9;
                  return;
                case 7:
                  dVar1 = ptVar7->value_->doubleVal_;
                  const_val->valType_ = CV_DOUBLE;
                  const_val->doubleVal_ = dVar1;
                  return;
                default:
                  return;
                }
              }
              iVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[0x10])(ptVar8);
              if ((char)iVar3 != '\0') {
                ptVar2 = ptVar7->value_;
                const_val->valType_ = CV_MAP;
                for (p_Var5 = (ptVar2->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    ; (_Rb_tree_header *)p_Var5 !=
                      &(ptVar2->mapVal_)._M_t._M_impl.super__Rb_tree_header;
                    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
                  t_const_value::add_map
                            (const_val,*(t_const_value **)(p_Var5 + 1),
                             (t_const_value *)p_Var5[1]._M_parent);
                }
                return;
              }
              iVar3 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xe])(ptVar8);
              if ((char)iVar3 == '\0') {
                return;
              }
              ptVar2 = ptVar7->value_;
              const_val->valType_ = CV_LIST;
              for (pptVar13 = (ptVar2->listVal_).
                              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  pptVar13 !=
                  (ptVar2->listVal_).
                  super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                  super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
                t_const_value::add_list(const_val,*pptVar13);
              }
              return;
            }
          }
          else {
            if ((char)iVar3 == '\0') {
              return;
            }
            iVar9 = t_const_value::get_integer(const_val);
            ptVar10 = t_enum::get_constant_by_value((t_enum *)ttype,iVar9);
            if (ptVar10 == (t_enum_value *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&valstm);
              t_const_value::get_integer(const_val);
              std::ostream::_M_insert<long>((long)&valstm);
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
              std::operator+(&local_248,"Couldn\'t find a named value in enum ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_01,iVar3));
              std::operator+(&bStack_288,&local_248," for value ");
              std::__cxx11::stringbuf::str();
              std::operator+(pbVar11,&bStack_288,&local_268);
              __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &valstm,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(extraout_var,iVar3),".");
            std::operator+(&local_228,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &valstm,&ptVar10->name_);
            t_const_value::set_identifier(const_val,&local_228);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::~string((string *)&valstm);
          }
          const_val->enum_ = (t_enum *)ttype;
        }
        else {
          for (p_Var5 = (const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var5 != &(const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
            std::__cxx11::string::string
                      ((string *)&local_1c8,(string *)(*(long *)(p_Var5 + 1) + 0x48));
            ptVar6 = t_struct::get_field_by_name((t_struct *)ttype,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            if (ptVar6 == (t_field *)0x0) {
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              std::__cxx11::string::string
                        ((string *)&local_268,(string *)(*(long *)(p_Var5 + 1) + 0x48));
              std::operator+(&local_248,"No field named \"",&local_268);
              std::operator+(&bStack_288,&local_248,"\" was found in struct of type \"");
              iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &valstm,&bStack_288,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar3));
              std::operator+(pbVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&valstm,"\"");
              __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            resolve_const_value(this,(t_const_value *)p_Var5[1]._M_parent,ptVar6->type_);
          }
        }
      }
      else {
        for (pptVar13 = (const_val->listVal_).
                        super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            pptVar13 !=
            (const_val->listVal_).
            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
          resolve_const_value(this,*pptVar13,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        }
      }
    }
    else {
      for (pptVar13 = (const_val->listVal_).
                      super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pptVar13 !=
          (const_val->listVal_).
          super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
        resolve_const_value(this,*pptVar13,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      }
    }
  }
  else {
    for (p_Var5 = (const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      resolve_const_value(this,*(t_const_value **)(p_Var5 + 1),
                          *(t_type **)&ttype[1].super_t_doc.has_doc_);
      resolve_const_value(this,(t_const_value *)p_Var5[1]._M_parent,
                          *(t_type **)&ttype[1].annotations_._M_t._M_impl);
    }
  }
  return;
}

Assistant:

void resolve_const_value(t_const_value* const_val, t_type* ttype) {
    if (ttype->is_map()) {
      const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = const_val->get_map();
      std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
      for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
        resolve_const_value(v_iter->first, ((t_map*)ttype)->get_key_type());
        resolve_const_value(v_iter->second, ((t_map*)ttype)->get_val_type());
      }
    } else if (ttype->is_list()) {
      const std::vector<t_const_value*>& val = const_val->get_list();
      std::vector<t_const_value*>::const_iterator v_iter;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        resolve_const_value((*v_iter), ((t_list*)ttype)->get_elem_type());
      }
    } else if (ttype->is_set()) {
      const std::vector<t_const_value*>& val = const_val->get_list();
      std::vector<t_const_value*>::const_iterator v_iter;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        resolve_const_value((*v_iter), ((t_set*)ttype)->get_elem_type());
      }
    } else if (ttype->is_struct()) {
      auto* tstruct = (t_struct*)ttype;
      const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = const_val->get_map();
      std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
      for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
        t_field* field = tstruct->get_field_by_name(v_iter->first->get_string());
        if (field == nullptr) {
          throw "No field named \"" + v_iter->first->get_string()
              + "\" was found in struct of type \"" + tstruct->get_name() + "\"";
        }
        resolve_const_value(v_iter->second, field->get_type());
      }
    } else if (const_val->get_type() == t_const_value::CV_IDENTIFIER) {
      if (ttype->is_enum()) {
        const_val->set_enum((t_enum*)ttype);
      } else {
        t_const* constant = get_constant(const_val->get_identifier());
        if (constant == nullptr) {
          throw "No enum value or constant found named \"" + const_val->get_identifier() + "\"!";
        }

        // Resolve typedefs to the underlying type
        t_type* const_type = constant->get_type()->get_true_type();

        if (const_type->is_base_type()) {
          switch (((t_base_type*)const_type)->get_base()) {
          case t_base_type::TYPE_I16:
          case t_base_type::TYPE_I32:
          case t_base_type::TYPE_I64:
          case t_base_type::TYPE_BOOL:
          case t_base_type::TYPE_I8:
            const_val->set_integer(constant->get_value()->get_integer());
            break;
          case t_base_type::TYPE_STRING:
            const_val->set_string(constant->get_value()->get_string());
            break;
          case t_base_type::TYPE_DOUBLE:
            const_val->set_double(constant->get_value()->get_double());
            break;
          case t_base_type::TYPE_VOID:
            throw "Constants cannot be of type VOID";
          }
        } else if (const_type->is_map()) {
          const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = constant->get_value()->get_map();
          std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

          const_val->set_map();
          for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
            const_val->add_map(v_iter->first, v_iter->second);
          }
        } else if (const_type->is_list()) {
          const std::vector<t_const_value*>& val = constant->get_value()->get_list();
          std::vector<t_const_value*>::const_iterator v_iter;

          const_val->set_list();
          for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
            const_val->add_list(*v_iter);
          }
        }
      }
    } else if (ttype->is_enum()) {
      // enum constant with non-identifier value. set the enum and find the
      // value's name.
      auto* tenum = (t_enum*)ttype;
      t_enum_value* enum_value = tenum->get_constant_by_value(const_val->get_integer());
      if (enum_value == nullptr) {
        std::ostringstream valstm;
        valstm << const_val->get_integer();
        throw "Couldn't find a named value in enum " + tenum->get_name() + " for value "
            + valstm.str();
      }
      const_val->set_identifier(tenum->get_name() + "." + enum_value->get_name());
      const_val->set_enum(tenum);
    }
  }